

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsMessageSetData(HelicsMessage message,void *data,int inputDataLength,HelicsError *err)

{
  Message *pMVar1;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  pMVar1 = getMessageObj(message,err);
  if (pMVar1 != (Message *)0x0) {
    local_20._M_len = (size_t)inputDataLength;
    local_20._M_str = (char *)data;
    helics::SmallBuffer::operator=(&pMVar1->data,&local_20);
  }
  return;
}

Assistant:

void helicsMessageSetData(HelicsMessage message, const void* data, int inputDataLength, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->data = std::string_view(static_cast<const char*>(data), inputDataLength);
}